

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

gdImagePtr gdImageNeuQuant(gdImagePtr im,int max_color,int sample_factor)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  nn_quant *ptr;
  long lVar4;
  nn_quant *pnVar5;
  int *piVar6;
  gdImagePtr pgVar7;
  ulong uVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  undefined1 uVar14;
  int iVar15;
  nq_pixel *__s;
  ulong uVar16;
  bool bVar17;
  uchar map [256] [4];
  int remap [256];
  byte local_838 [1024];
  byte abStack_438 [1032];
  
  uVar16 = (ulong)(uint)max_color;
  iVar10 = 3;
  if (0 < sample_factor) {
    iVar10 = sample_factor;
  }
  iVar2 = overflow2(im->sx,im->sy);
  if (((iVar2 == 0) && (iVar2 = overflow2(im->sy * im->sx,4), iVar2 == 0)) &&
     (ptr = (nn_quant *)gdMalloc((long)(im->sx * im->sy * 4)), ptr != (nn_quant *)0x0)) {
    iVar2 = im->sy;
    if (0 < iVar2) {
      iVar11 = im->sx;
      lVar4 = 0;
      pnVar5 = ptr;
      do {
        if (0 < iVar11) {
          piVar6 = im->tpixels[lVar4];
          iVar2 = 0;
          do {
            iVar11 = *piVar6;
            if (im->trueColor == 0) {
              bVar13 = (byte)im->alpha[iVar11];
            }
            else {
              bVar13 = (byte)((uint)iVar11 >> 0x18) & 0x7f;
            }
            *(byte *)&pnVar5->alphadec = bVar13;
            if (im->trueColor == 0) {
              uVar14 = (undefined1)im->red[iVar11];
            }
            else {
              uVar14 = (undefined1)((uint)iVar11 >> 0x10);
            }
            *(undefined1 *)((long)&pnVar5->alphadec + 1) = uVar14;
            iVar15 = iVar11;
            if (im->trueColor == 0) {
              iVar15 = im->blue[iVar11];
            }
            *(char *)((long)&pnVar5->alphadec + 2) = (char)iVar15;
            if (im->trueColor == 0) {
              uVar14 = (undefined1)im->green[iVar11];
            }
            else {
              uVar14 = (undefined1)((uint)iVar11 >> 8);
            }
            *(undefined1 *)((long)&pnVar5->alphadec + 3) = uVar14;
            pnVar5 = (nn_quant *)&pnVar5->lengthcount;
            piVar6 = piVar6 + 1;
            iVar2 = iVar2 + 1;
            iVar11 = im->sx;
          } while (iVar2 < iVar11);
          iVar2 = im->sy;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
    pnVar5 = (nn_quant *)gdMalloc(0x2098);
    if (pnVar5 == (nn_quant *)0x0) {
      pgVar7 = (gdImagePtr)0x0;
    }
    else {
      iVar2 = im->sy;
      iVar11 = im->sx;
      __s = pnVar5->network;
      memset(__s,0,0x1400);
      pnVar5->thepicture = (uchar *)ptr;
      pnVar5->lengthcount = iVar2 * iVar11 * 4;
      pnVar5->samplefac = iVar10;
      pnVar5->netsize = max_color;
      if (0 < max_color) {
        uVar8 = 0;
        piVar6 = pnVar5->freq;
        do {
          iVar10 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                        (long)max_color);
          (*__s)[0] = iVar10;
          (*__s)[1] = iVar10;
          (*__s)[2] = iVar10;
          (*__s)[3] = iVar10;
          *piVar6 = (int)(0x10000 / uVar16);
          piVar6[-0x100] = 0;
          uVar8 = uVar8 + 0x1000;
          piVar6 = piVar6 + 1;
          __s = __s + 1;
        } while (uVar16 << 0xc != uVar8);
      }
      learn(pnVar5,1);
      unbiasnet(pnVar5);
      if (0 < pnVar5->netsize) {
        piVar6 = pnVar5->network[0] + 3;
        pbVar9 = local_838;
        lVar4 = 0;
        do {
          lVar12 = 0;
          do {
            *pbVar9 = *(byte *)((long)piVar6 + lVar12);
            pbVar9 = pbVar9 + 1;
            lVar12 = lVar12 + -4;
          } while (lVar12 != -0x10);
          lVar4 = lVar4 + 1;
          piVar6 = piVar6 + 5;
        } while (lVar4 < pnVar5->netsize);
      }
      inxbuild(pnVar5);
      iVar10 = max_color + -1;
      if (max_color < 1) {
        iVar2 = 0;
      }
      else {
        uVar8 = 0;
        iVar2 = 0;
        do {
          bVar17 = abStack_438[uVar8 * 4 + -0x3fd] == 0xff;
          iVar11 = iVar2;
          if (bVar17) {
            iVar11 = iVar10;
          }
          iVar10 = iVar10 - (uint)bVar17;
          iVar2 = iVar2 + (uint)!bVar17;
          *(int *)(abStack_438 + uVar8 * 4) = iVar11;
          uVar8 = uVar8 + 1;
        } while (uVar16 != uVar8);
      }
      if (iVar2 == iVar10 + 1) {
        pgVar7 = gdImageCreate(im->sx,im->sy);
        if (pgVar7 == (gdImagePtr)0x0) {
          pgVar7 = (gdImagePtr)0x0;
        }
        else {
          if (0 < max_color) {
            uVar8 = 0;
            do {
              iVar10 = *(int *)(abStack_438 + uVar8 * 4);
              pgVar7->red[iVar10] = (uint)abStack_438[(uVar8 - 0x100) * 4];
              pgVar7->green[iVar10] = (uint)abStack_438[uVar8 * 4 + -0x3ff];
              pgVar7->blue[iVar10] = (uint)abStack_438[uVar8 * 4 + -0x3fe];
              pgVar7->alpha[iVar10] = (uint)abStack_438[uVar8 * 4 + -0x3fd];
              pgVar7->open[iVar10] = 0;
              pgVar7->colorsTotal = pgVar7->colorsTotal + 1;
              uVar8 = uVar8 + 1;
            } while (uVar16 != uVar8);
          }
          iVar10 = im->sy;
          if (0 < iVar10) {
            iVar2 = im->sx;
            iVar11 = 0;
            lVar4 = 0;
            do {
              if (0 < iVar2) {
                puVar1 = pgVar7->pixels[lVar4];
                iVar10 = iVar2 * iVar11;
                lVar12 = 0;
                do {
                  uVar3 = inxsearch(pnVar5,(uint)*(byte *)((long)ptr->netindex +
                                                          (long)iVar10 + -0x10),
                                    (uint)*(byte *)((long)ptr->netindex + (long)(iVar10 + 2) + -0x10
                                                   ),
                                    (uint)*(byte *)((long)ptr->netindex + (long)(iVar10 + 3) + -0x10
                                                   ),
                                    (uint)*(byte *)((long)ptr->netindex + (long)(iVar10 + 1) + -0x10
                                                   ));
                  puVar1[lVar12] = abStack_438[(ulong)uVar3 * 4];
                  lVar12 = lVar12 + 1;
                  iVar2 = im->sx;
                  iVar10 = iVar10 + 4;
                } while (lVar12 < iVar2);
                iVar10 = im->sy;
              }
              lVar4 = lVar4 + 1;
              iVar11 = iVar11 + 4;
            } while (lVar4 < iVar10);
          }
        }
      }
      else {
        pgVar7 = (gdImagePtr)0x0;
        gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n");
      }
      gdFree(ptr);
      ptr = pnVar5;
      if (pnVar5 == (nn_quant *)0x0) {
        return pgVar7;
      }
    }
    gdFree(ptr);
  }
  else {
    pgVar7 = (gdImagePtr)0x0;
  }
  return pgVar7;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageNeuQuant(gdImagePtr im, const int max_color, int sample_factor)
{
	const int newcolors = max_color;
	const int verbose = 1;

	int bot_idx, top_idx; /* for remapping of indices */
	int remap[MAXNETSIZE];
	int i,x;

	unsigned char map[MAXNETSIZE][4];
	unsigned char *d;

	nn_quant *nnq = NULL;

	int row;
	unsigned char *rgba = NULL;
	gdImagePtr dst = NULL;

	/* Default it to 3 */
	if (sample_factor < 1) {
		sample_factor = 3;
	}
	/* Start neuquant */
	/* Pierre:
	 * This implementation works with aligned contiguous buffer only
	 * Upcoming new buffers are contiguous and will be much faster.
	 * let don't bloat this code to support our good "old" 31bit format.
	 * It alos lets us convert palette image, if one likes to reduce
	 * a palette
	 */
	if (overflow2(gdImageSX(im), gdImageSY(im))
	        || overflow2(gdImageSX(im) * gdImageSY(im), 4)) {
		goto done;
	}
	rgba = (unsigned char *) gdMalloc(gdImageSX(im) * gdImageSY(im) * 4);
	if (!rgba) {
		goto done;
	}

	d = rgba;
	for (row = 0; row < gdImageSY(im); row++) {
		int *p = im->tpixels[row];
		register int c;

		for (i = 0; i < gdImageSX(im); i++) {
			c = *p;
			*d++ = gdImageAlpha(im, c);
			*d++ = gdImageRed(im, c);
			*d++ = gdImageBlue(im, c);
			*d++ = gdImageGreen(im, c);
			p++;
		}
	}

	nnq = (nn_quant *) gdMalloc(sizeof(nn_quant));
	if (!nnq) {
		goto done;
	}

	initnet(nnq, rgba, gdImageSY(im) * gdImageSX(im) * 4, sample_factor, newcolors);

	learn(nnq, verbose);
	unbiasnet(nnq);
	getcolormap(nnq, (unsigned char*)map);
	inxbuild(nnq);
	/* remapping colormap to eliminate opaque tRNS-chunk entries... */
	for (top_idx = newcolors-1, bot_idx = x = 0;  x < newcolors;  ++x) {
		if (map[x][3] == 255) { /* maxval */
			remap[x] = top_idx--;
		} else {
			remap[x] = bot_idx++;
		}
	}
	if (bot_idx != top_idx + 1) {
		gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",
			 bot_idx, top_idx);
		goto done;
	}

	dst = gdImageCreate(gdImageSX(im), gdImageSY(im));
	if (!dst) {
		goto done;
	}

	for (x = 0; x < newcolors; ++x) {
		dst->red[remap[x]] = map[x][0];
		dst->green[remap[x]] = map[x][1];
		dst->blue[remap[x]] = map[x][2];
		dst->alpha[remap[x]] = map[x][3];
		dst->open[remap[x]] = 0;
		dst->colorsTotal++;
	}

	/* Do each image row */
	for ( row = 0; row < gdImageSY(im); ++row ) {
		int offset;
		unsigned char *p = dst->pixels[row];

		/* Assign the new colors */
		offset = row * gdImageSX(im) * 4;
		for(i=0; i < gdImageSX(im); i++) {
			p[i] = remap[
			           inxsearch(nnq, rgba[i * 4 + offset + ALPHA],
			                     rgba[i * 4 + offset + BLUE],
			                     rgba[i * 4 + offset + GREEN],
			                     rgba[i * 4 + offset + RED])
			       ];
		}
	}

done:
	if (rgba) {
		gdFree(rgba);
	}

	if (nnq) {
		gdFree(nnq);
	}
	return dst;
}